

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O2

void __thiscall
charls::process_transformed<charls::transform_hp3<unsigned_short>_>::decode_transform
          (process_transformed<charls::transform_hp3<unsigned_short>_> *this,void *source,
          void *destination,size_t pixel_count,size_t byte_stride)

{
  int iVar1;
  interleave_mode iVar2;
  
  iVar1 = this->frame_info_->component_count;
  if (iVar1 == 4) {
    iVar2 = this->parameters_->interleave_mode;
    if (iVar2 == Line) {
      transform_line_to_quad<charls::transform_hp3<unsigned_short>::inverse,unsigned_short>
                ((unsigned_short *)source,byte_stride,(quad<unsigned_short> *)destination,
                 pixel_count,(inverse *)&this->field_0x51);
    }
    else if (iVar2 == Sample) {
      transform_line<charls::transform_hp3<unsigned_short>::inverse,unsigned_short>
                ((quad<unsigned_short> *)destination,(quad<unsigned_short> *)source,pixel_count,
                 (inverse *)&this->field_0x51);
    }
  }
  else if (iVar1 == 3) {
    if (this->parameters_->interleave_mode == Sample) {
      transform_line<charls::transform_hp3<unsigned_short>::inverse,unsigned_short>
                ((triplet<unsigned_short> *)destination,(triplet<unsigned_short> *)source,
                 pixel_count,(inverse *)&this->field_0x51);
    }
    else {
      transform_line_to_triplet<charls::transform_hp3<unsigned_short>::inverse,unsigned_short>
                ((unsigned_short *)source,byte_stride,(triplet<unsigned_short> *)destination,
                 pixel_count,(inverse *)&this->field_0x51);
    }
  }
  if (this->parameters_->output_bgr == true) {
    transform_rgb_to_bgr<unsigned_short>
              ((unsigned_short *)destination,(long)this->frame_info_->component_count,pixel_count);
    return;
  }
  return;
}

Assistant:

void decode_transform(const void* source, void* destination, const size_t pixel_count, const size_t byte_stride) noexcept
    {
        if (frame_info_.component_count == 3)
        {
            if (parameters_.interleave_mode == interleave_mode::sample)
            {
                transform_line(static_cast<triplet<size_type>*>(destination), static_cast<const triplet<size_type>*>(source),
                               pixel_count, inverse_transform_);
            }
            else
            {
                transform_line_to_triplet(static_cast<const size_type*>(source), byte_stride,
                                          static_cast<triplet<size_type>*>(destination), pixel_count, inverse_transform_);
            }
        }
        else if (frame_info_.component_count == 4)
        {
            if (parameters_.interleave_mode == interleave_mode::sample)
            {
                transform_line(static_cast<quad<size_type>*>(destination), static_cast<const quad<size_type>*>(source),
                               pixel_count, inverse_transform_);
            }
            else if (parameters_.interleave_mode == interleave_mode::line)
            {
                transform_line_to_quad(static_cast<const size_type*>(source), byte_stride,
                                       static_cast<quad<size_type>*>(destination), pixel_count, inverse_transform_);
            }
        }

        if (parameters_.output_bgr)
        {
            transform_rgb_to_bgr(static_cast<size_type*>(destination), frame_info_.component_count, pixel_count);
        }
    }